

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

void __thiscall LinkedObjectFile::find_functions(LinkedObjectFile *this)

{
  uint32_t *puVar1;
  pointer puVar2;
  pointer pvVar3;
  long lVar4;
  pointer pvVar5;
  Function *pFVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  undefined8 in_RAX;
  ulong uVar10;
  ulong uVar11;
  Function *__a;
  ulong uVar12;
  Function *__b;
  int function_end;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (this->segments == 1) {
    puVar2 = (this->offset_of_data_zone_by_seg).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->offset_of_data_zone_by_seg).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish == puVar2) {
      uVar10 = 0;
      uVar12 = 0;
LAB_0012e7d1:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12,
                 uVar10);
    }
    if (*puVar2 != 0) {
      __assert_fail("offset_of_data_zone_by_seg.at(0) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x171,"void LinkedObjectFile::find_functions()");
    }
  }
  else if (0 < this->segments) {
    uVar11 = 0;
    while( true ) {
      puVar2 = (this->offset_of_data_zone_by_seg).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (long)(this->offset_of_data_zone_by_seg).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
      uVar12 = uVar11;
      if (uVar10 <= uVar11) break;
      uVar7 = puVar2[uVar11];
      local_38 = CONCAT44(uVar7,(uint)local_38);
LAB_0012e67d:
      if (0 < (int)uVar7) {
        uVar7 = uVar7 - 1;
        local_38 = CONCAT44(local_38._4_4_,uVar7);
        do {
          pvVar3 = (this->words_by_seg).
                   super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar10 = ((long)(this->words_by_seg).
                          super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                   -0x5555555555555555;
          uVar12 = uVar11;
          if (uVar10 < uVar11 || uVar10 - uVar11 == 0) goto LAB_0012e7d1;
          uVar12 = (ulong)uVar7;
          lVar4 = *(long *)&pvVar3[uVar11].
                            super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                            super__Vector_impl_data;
          uVar10 = ((long)*(pointer *)
                           ((long)&pvVar3[uVar11].
                                   super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                   _M_impl.super__Vector_impl_data + 8) - lVar4 >> 4) *
                   -0x5555555555555555;
          if (uVar10 < uVar12 || uVar10 - uVar12 == 0) goto LAB_0012e7d1;
          uVar9 = uVar7;
          if (*(int *)(lVar4 + uVar12 * 0x30) == 7) {
            iVar8 = std::__cxx11::string::compare((char *)(lVar4 + uVar12 * 0x30 + 0x10));
            if (iVar8 == 0) goto LAB_0012e6fa;
            uVar9 = (uint)local_38;
          }
          uVar7 = uVar9 - 1;
          local_38 = CONCAT44(local_38._4_4_,uVar7);
          if ((int)uVar9 < 1) {
            __assert_fail("found_function_tag_loc",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                          ,0x187,"void LinkedObjectFile::find_functions()");
          }
        } while( true );
      }
      pvVar5 = (this->functions_by_seg).
               super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(this->functions_by_seg).
                      super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
               -0x5555555555555555;
      uVar12 = uVar11;
      if (uVar10 < uVar11 || uVar10 - uVar11 == 0) break;
      __a = pvVar5[uVar11].super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
            super__Vector_impl_data._M_start;
      pFVar6 = *(pointer *)
                ((long)&pvVar5[uVar11].super__Vector_base<Function,_std::allocator<Function>_>.
                        _M_impl.super__Vector_impl_data + 8);
      __b = pFVar6 + -1;
      if (__a < __b && __a != pFVar6) {
        do {
          std::swap<Function>(__a,__b);
          __a = __a + 1;
          __b = __b + -1;
        } while (__a < __b);
      }
      uVar11 = uVar11 + 1;
      if ((long)this->segments <= (long)uVar11) {
        return;
      }
    }
    goto LAB_0012e7d1;
  }
  return;
LAB_0012e6fa:
  puVar1 = &(this->stats).function_count;
  *puVar1 = *puVar1 + 1;
  pvVar5 = (this->functions_by_seg).
           super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = ((long)(this->functions_by_seg).
                  super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
           -0x5555555555555555;
  uVar12 = uVar11;
  if (uVar10 < uVar11 || uVar10 - uVar11 == 0) goto LAB_0012e7d1;
  std::vector<Function,std::allocator<Function>>::emplace_back<int&,int&>
            ((vector<Function,std::allocator<Function>> *)(pvVar5 + uVar11),(int *)&local_38,
             (int *)((long)&local_38 + 4));
  local_38 = CONCAT44((uint)local_38,(uint)local_38);
  uVar7 = (uint)local_38;
  goto LAB_0012e67d;
}

Assistant:

void LinkedObjectFile::find_functions() {
  if (segments == 1) {
    // it's a v2 file, shouldn't have any functions
    assert(offset_of_data_zone_by_seg.at(0) == 0);
  } else {
    // we assume functions don't have any data in between them, so we use the "function" type tag to
    // mark the end of the previous function and the start of the next.  This means that some
    // functions will have a few 0x0 words after then for padding (GOAL functions are aligned), but
    // this is something that the disassembler should handle.
    for (int seg = 0; seg < segments; seg++) {
      // start at the end and work backward...
      int function_end = offset_of_data_zone_by_seg.at(seg);
      while (function_end > 0) {
        // back up until we find function type tag
        int function_tag_loc = function_end;
        bool found_function_tag_loc = false;
        for (; function_tag_loc-- > 0;) {
          auto& word = words_by_seg.at(seg).at(function_tag_loc);
          if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
            found_function_tag_loc = true;
            break;
          }
        }

        // mark this as a function, and try again from the current function start
        assert(found_function_tag_loc);
        stats.function_count++;
        functions_by_seg.at(seg).emplace_back(function_tag_loc, function_end);
        function_end = function_tag_loc;
      }

      std::reverse(functions_by_seg.at(seg).begin(), functions_by_seg.at(seg).end());
    }
  }
}